

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

void report(long total_micros,int count)

{
  ostream *poVar1;
  double dVar2;
  
  dVar2 = (double)total_micros / 1000000.0;
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"    num: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  std::operator<<(poVar1,", total_seconds: ");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1,", num_per_second: ");
  poVar1 = std::ostream::_M_insert<double>((double)count / dVar2);
  std::operator<<(poVar1,", micros_per: ");
  poVar1 = std::ostream::_M_insert<double>((double)total_micros / (double)count);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void report(long total_micros, int count) {
  double total_seconds = static_cast<double>(total_micros) / 1e6;
  double num_per_second = count / total_seconds;
  double micros_per = static_cast<double>(total_micros) / count;
  std::cout << std::endl
            << "    num: " << count << ", total_seconds: " << total_seconds << ", num_per_second: " << num_per_second
            << ", micros_per: " << micros_per << std::endl;
}